

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

ReaderData * __thiscall BufferedReader::getReader(BufferedReader *this,int readerID)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ReaderData *pRVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar1 == 0) {
    p_Var4 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < readerID]
        ) {
      if (readerID <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) &&
       (p_Var3 = p_Var2, readerID < (int)p_Var2[1]._M_color)) {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var4) {
      pRVar5 = (ReaderData *)0x0;
    }
    else {
      pRVar5 = (ReaderData *)p_Var3[1]._M_parent;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return pRVar5;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ReaderData* BufferedReader::getReader(const int readerID)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    return itr != m_readers.end() ? itr->second : nullptr;
}